

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QBitArray *array)

{
  char *pcVar1;
  storage_type *in_RCX;
  long lVar2;
  long in_RDX;
  char *pcVar3;
  QTextStream *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,(QDebug *)array);
  pQVar4 = (QTextStream *)(array->d).d.d;
  *(undefined1 *)&pQVar4[3]._vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QBitArray(";
  QString::fromUtf8(&local_48,(QString *)0xa,ba);
  QTextStream::operator<<(pQVar4,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar4 = (QTextStream *)(array->d).d.d;
  if (*(char *)&pQVar4[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar4,' ');
  }
  pcVar1 = *(char **)(in_RDX + 8);
  lVar2 = *(long *)(in_RDX + 0x10) * 8;
  pcVar3 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar3 = &QByteArray::_empty;
  }
  if (lVar2 != *pcVar3 && -1 < lVar2 - *pcVar3) {
    uVar5 = 0;
    do {
      pQVar4 = (QTextStream *)(array->d).d.d;
      if (((byte)pcVar1[(uVar5 >> 3) + 1] >> ((uint)uVar5 & 7) & 1) == 0) {
        QTextStream::operator<<(pQVar4,'0');
        pQVar4 = (QTextStream *)(array->d).d.d;
        if (*(char *)&(((QArrayData *)&pQVar4[3]._vptr_QTextStream)->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') goto LAB_00354003;
      }
      else {
        QTextStream::operator<<(pQVar4,'1');
        pQVar4 = (QTextStream *)(array->d).d.d;
        if (*(char *)&(((QArrayData *)&pQVar4[3]._vptr_QTextStream)->ref_)._q_value.
                      super___atomic_base<int>._M_i != '\0') {
LAB_00354003:
          QTextStream::operator<<(pQVar4,' ');
        }
      }
      uVar5 = uVar5 + 1;
      if ((uVar5 & 3) == 0) {
        pcVar1 = *(char **)(in_RDX + 8);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = &QByteArray::_empty;
        }
        if ((long)uVar5 < *(long *)(in_RDX + 0x10) * 8 - (long)*pcVar1) {
          QTextStream::operator<<((QTextStream *)(array->d).d.d,' ');
          pQVar4 = (QTextStream *)(array->d).d.d;
          if (*(char *)&pQVar4[3]._vptr_QTextStream == '\x01') {
            QTextStream::operator<<(pQVar4,' ');
          }
        }
      }
      pcVar1 = *(char **)(in_RDX + 8);
      pcVar3 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        pcVar3 = &QByteArray::_empty;
      }
    } while ((long)uVar5 < *(long *)(in_RDX + 0x10) * 8 - (long)*pcVar3);
  }
  QTextStream::operator<<((QTextStream *)(array->d).d.d,')');
  pQVar4 = (QTextStream *)(array->d).d.d;
  if (*(char *)&pQVar4[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)(array->d).d.d;
  }
  (array->d).d.d = (Data *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar4;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QBitArray &array)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QBitArray(";
    for (qsizetype i = 0; i < array.size();) {
        if (array.testBit(i))
            dbg << '1';
        else
            dbg << '0';
        i += 1;
        if (!(i % 4) && (i < array.size()))
            dbg << ' ';
    }
    dbg << ')';
    return dbg;
}